

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O0

string * __thiscall
cmsys::SystemInformationImplementation::GetProgramStack_abi_cxx11_
          (string *__return_storage_ptr__,SystemInformationImplementation *this,int firstFrame,
          int wholePath)

{
  ostream *this_00;
  string local_a50 [32];
  undefined1 local_a30 [8];
  SymbolProperties symProps;
  int i;
  int nFrames;
  void *stackSymbols [256];
  ostringstream oss;
  allocator<char> local_1a;
  byte local_19;
  int local_18;
  int local_14;
  int wholePath_local;
  int firstFrame_local;
  string *programStack;
  
  local_14 = (int)this;
  local_19 = 0;
  local_18 = firstFrame;
  _wholePath_local = __return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,
             "WARNING: The stack trace will not use advanced capabilities because this is a release build.\n"
             ,&local_1a);
  std::allocator<char>::~allocator(&local_1a);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(stackSymbols + 0xff));
  symProps._124_4_ = backtrace(&i,0x100);
  for (symProps.ReportPath = local_14; symProps.ReportPath < (int)symProps._124_4_;
      symProps.ReportPath = symProps.ReportPath + 1) {
    anon_unknown_3::SymbolProperties::SymbolProperties((SymbolProperties *)local_a30);
    anon_unknown_3::SymbolProperties::SetReportPath((SymbolProperties *)local_a30,local_18);
    anon_unknown_3::SymbolProperties::Initialize
              ((SymbolProperties *)local_a30,*(void **)(&i + (long)symProps.ReportPath * 2));
    this_00 = anon_unknown_3::operator<<
                        ((ostream *)(stackSymbols + 0xff),(SymbolProperties *)local_a30);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    anon_unknown_3::SymbolProperties::~SymbolProperties((SymbolProperties *)local_a30);
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_a50);
  std::__cxx11::string::~string(local_a50);
  local_19 = 1;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(stackSymbols + 0xff));
  if ((local_19 & 1) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SystemInformationImplementation::GetProgramStack(int firstFrame,
                                                             int wholePath)
{
  std::string programStack = ""
#if !defined(KWSYS_SYSTEMINFORMATION_HAS_BACKTRACE)
                             "WARNING: The stack could not be examined "
                             "because backtrace is not supported.\n"
#elif !defined(KWSYS_SYSTEMINFORMATION_HAS_DEBUG_BUILD)
                             "WARNING: The stack trace will not use advanced "
                             "capabilities because this is a release build.\n"
#else
#  if !defined(KWSYS_SYSTEMINFORMATION_HAS_SYMBOL_LOOKUP)
                             "WARNING: Function names will not be demangled "
                             "because "
                             "dladdr is not available.\n"
#  endif
#  if !defined(KWSYS_SYSTEMINFORMATION_HAS_CPP_DEMANGLE)
                             "WARNING: Function names will not be demangled "
                             "because cxxabi is not available.\n"
#  endif
#endif
    ;

  std::ostringstream oss;
#if defined(KWSYS_SYSTEMINFORMATION_HAS_BACKTRACE)
  void* stackSymbols[256];
  int nFrames = backtrace(stackSymbols, 256);
  for (int i = firstFrame; i < nFrames; ++i) {
    SymbolProperties symProps;
    symProps.SetReportPath(wholePath);
    symProps.Initialize(stackSymbols[i]);
    oss << symProps << std::endl;
  }
#else
  (void)firstFrame;
  (void)wholePath;
#endif
  programStack += oss.str();

  return programStack;
}